

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O0

array_t<signed_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_int4_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  pointer this_00;
  iterator __first;
  iterator __last;
  size_t numElements;
  size_type count;
  Int4 *ptr;
  uint64_t in_RDX;
  Span<const_MILBlob::Int4,_18446744073709551615UL> span;
  handle local_a8 [3];
  allocator<unsigned_char> local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined1 local_70 [8];
  vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> unpackedInt4Data;
  undefined1 local_40 [8];
  Span<const_unsigned_char,_18446744073709551615UL> packedValuesSpan;
  Span<const_MILBlob::Int4,_18446744073709551615UL> int4SpanData;
  uint64_t offset_local;
  MilStoragePythonReader *this_local;
  
  this_00 = std::
            unique_ptr<MILBlob::Blob::StorageReader,_std::default_delete<MILBlob::Blob::StorageReader>_>
            ::operator->((unique_ptr<MILBlob::Blob::StorageReader,_std::default_delete<MILBlob::Blob::StorageReader>_>
                          *)offset);
  join_0x00000010_0x00000000_ =
       MILBlob::Blob::StorageReader::GetDataView<MILBlob::Int4>(this_00,in_RDX);
  span.m_size = packedValuesSpan._16_8_;
  unpackedInt4Data.super__Vector_base<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)packedValuesSpan.m_size.m_size;
  span.m_ptr = (type)span.m_size.m_size;
  _local_40 = MILBlob::Util::CastFromBitSpan<const_MILBlob::Int4,_true>
                        ((Util *)packedValuesSpan.m_size.m_size,span);
  __first = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::begin
                      ((Span<const_unsigned_char,_18446744073709551615UL> *)local_40);
  __last = MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::end
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)local_40);
  std::allocator<unsigned_char>::allocator(&local_89);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,__first,__last,
             &local_89);
  numElements = MILBlob::Util::Span<const_MILBlob::Int4,_18446744073709551615UL>::Size
                          ((Span<const_MILBlob::Int4,_18446744073709551615UL> *)
                           &packedValuesSpan.m_size);
  MILBlob::UnPackSubByteVec<MILBlob::Int4>
            ((vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *)local_70,&local_88,numElements
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::allocator<unsigned_char>::~allocator(&local_89);
  count = std::vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>::size
                    ((vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *)local_70);
  ptr = std::vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>::data
                  ((vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *)local_70);
  local_a8[0].m_ptr = (PyObject *)0x0;
  pybind11::handle::handle(local_a8);
  pybind11::array_t<signed_char,_16>::array_t
            ((array_t<signed_char,_16> *)this,count,&ptr->data,local_a8[0]);
  std::vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>::~vector
            ((vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *)local_70);
  return (array)(array)this;
}

Assistant:

py::array_t<int8_t> MilStoragePythonReader::read_int4_data(uint64_t offset) {
    // First read packed data using MILBlob reader, and restore to int8 values which represents int4.
    auto int4SpanData = m_reader->GetDataView<MILBlob::Int4>(offset);
    MILBlob::Util::Span<const uint8_t> packedValuesSpan = MILBlob::Util::CastFromBitSpan<const MILBlob::Int4>(int4SpanData);
    auto unpackedInt4Data = MILBlob::UnPackSubByteVec<MILBlob::Int4>({packedValuesSpan.begin(), packedValuesSpan.end()}, int4SpanData.Size());
    return py::array_t<int8_t>(unpackedInt4Data.size(), reinterpret_cast<int8_t*>(unpackedInt4Data.data()));
}